

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::AMFImporter::Postprocess_BuildConstellation
          (AMFImporter *this,CAMFImporter_NodeElement_Constellation *pConstellation,
          list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList)

{
  size_t *psVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong __n;
  long *******ppppppplVar18;
  bool bVar19;
  aiNode *this_00;
  aiNode *this_01;
  aiNode **ppaVar20;
  _List_node_base *p_Var21;
  long lVar22;
  _List_node_base *p_Var23;
  runtime_error *prVar24;
  iterator __begin1;
  long *******ppppppplVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  list<aiNode_*,_std::allocator<aiNode_*>_> ch_node;
  aiNode *found_node;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *******local_50;
  long *******local_48;
  ulong local_40;
  aiNode *local_38;
  
  local_40 = 0;
  local_50 = (long *******)&local_50;
  local_48 = (long *******)&local_50;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  __n = (pConstellation->super_CAMFImporter_NodeElement).ID._M_string_length;
  if (__n < 0x400) {
    (this_00->mName).length = (ai_uint32)__n;
    memcpy((this_00->mName).data,
           (pConstellation->super_CAMFImporter_NodeElement).ID._M_dataplus._M_p,__n);
    (this_00->mName).data[__n] = '\0';
  }
  p_Var23 = (pConstellation->super_CAMFImporter_NodeElement).Child.
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  do {
    ppppppplVar25 = local_50;
    if (p_Var23 == (_List_node_base *)&(pConstellation->super_CAMFImporter_NodeElement).Child) {
      if ((long ********)local_50 == &local_50) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"<constellation> must have at least one <instance>.","");
        std::runtime_error::runtime_error(prVar24,(string *)local_70);
        *(undefined ***)prVar24 = &PTR__runtime_error_0082bce0;
        __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00->mNumChildren = (uint)local_40;
      ppaVar20 = (aiNode **)operator_new__((local_40 & 0xffffffff) << 3);
      this_00->mChildren = ppaVar20;
      if ((long ********)ppppppplVar25 != &local_50) {
        lVar22 = 0;
        do {
          *(long *******)((long)this_00->mChildren + lVar22) = ppppppplVar25[2];
          ppppppplVar25 = (long *******)*ppppppplVar25;
          lVar22 = lVar22 + 8;
        } while ((long ********)ppppppplVar25 != &local_50);
      }
      p_Var23 = (_List_node_base *)operator_new(0x18);
      p_Var23[1]._M_next = (_List_node_base *)this_00;
      std::__detail::_List_node_base::_M_hook(p_Var23);
      psVar1 = &(pNodeList->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      ppppppplVar25 = local_50;
      while ((long ********)ppppppplVar25 != &local_50) {
        ppppppplVar18 = (long *******)*ppppppplVar25;
        operator_delete(ppppppplVar25,0x18);
        ppppppplVar25 = ppppppplVar18;
      }
      return;
    }
    p_Var21 = p_Var23[1]._M_next;
    if (*(int *)&p_Var21->_M_prev == 4) {
      bVar19 = Find_ConvertedNode(this,(string *)(p_Var21 + 5),pNodeList,&local_38);
      if (!bVar19) {
        Throw_ID_NotFound(this,(string *)(p_Var21 + 5));
      }
      this_01 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_01);
      this_01->mParent = this_00;
      fVar2 = *(float *)&p_Var21[7]._M_next;
      fVar3 = *(float *)((long)(p_Var21 + 7) + 4);
      fVar4 = *(float *)((long)(p_Var21 + 7) + 8);
      fVar5 = (this_01->mTransformation).a1;
      fVar6 = (this_01->mTransformation).a2;
      fVar7 = (this_01->mTransformation).a3;
      fVar8 = (this_01->mTransformation).a4;
      fVar31 = fVar8 * 0.0;
      fVar9 = (this_01->mTransformation).b1;
      fVar10 = (this_01->mTransformation).b2;
      fVar11 = (this_01->mTransformation).b3;
      fVar12 = (this_01->mTransformation).b4;
      fVar34 = fVar12 * 0.0;
      fVar13 = (this_01->mTransformation).c1;
      fVar14 = (this_01->mTransformation).c2;
      fVar15 = (this_01->mTransformation).c3;
      fVar16 = (this_01->mTransformation).c4;
      fVar26 = fVar16 * 0.0;
      fVar17 = (this_01->mTransformation).d1;
      fVar27 = (this_01->mTransformation).d2;
      fVar28 = (this_01->mTransformation).d3;
      fVar29 = (this_01->mTransformation).d4;
      fVar30 = fVar29 * 0.0;
      (this_01->mTransformation).a1 = fVar5 + fVar6 * 0.0 + fVar7 * 0.0 + fVar31;
      (this_01->mTransformation).a2 = fVar5 * 0.0 + fVar6 + fVar7 * 0.0 + fVar31;
      (this_01->mTransformation).a3 = fVar5 * 0.0 + fVar6 * 0.0 + fVar7 + fVar31;
      (this_01->mTransformation).a4 = fVar7 * fVar4 + fVar6 * fVar3 + fVar2 * fVar5 + fVar8;
      (this_01->mTransformation).b1 = fVar9 + fVar10 * 0.0 + fVar11 * 0.0 + fVar34;
      (this_01->mTransformation).b2 = fVar9 * 0.0 + fVar10 + fVar11 * 0.0 + fVar34;
      (this_01->mTransformation).b3 = fVar9 * 0.0 + fVar10 * 0.0 + fVar11 + fVar34;
      (this_01->mTransformation).b4 = fVar11 * fVar4 + fVar10 * fVar3 + fVar2 * fVar9 + fVar12;
      (this_01->mTransformation).c1 = fVar13 + fVar14 * 0.0 + fVar15 * 0.0 + fVar26;
      (this_01->mTransformation).c2 = fVar13 * 0.0 + fVar14 + fVar15 * 0.0 + fVar26;
      (this_01->mTransformation).c3 = fVar13 * 0.0 + fVar14 * 0.0 + fVar15 + fVar26;
      (this_01->mTransformation).c4 = fVar15 * fVar4 + fVar14 * fVar3 + fVar2 * fVar13 + fVar16;
      (this_01->mTransformation).d1 = fVar17 + fVar27 * 0.0 + fVar28 * 0.0 + fVar30;
      (this_01->mTransformation).d2 = fVar17 * 0.0 + fVar27 + fVar28 * 0.0 + fVar30;
      (this_01->mTransformation).d3 = fVar17 * 0.0 + fVar27 * 0.0 + fVar28 + fVar30;
      (this_01->mTransformation).d4 = fVar4 * fVar28 + fVar3 * fVar27 + fVar2 * fVar17 + fVar29;
      fVar2 = *(float *)((long)(p_Var21 + 7) + 0xc);
      fVar27 = cosf(fVar2);
      fVar28 = sinf(fVar2);
      fVar2 = (this_01->mTransformation).a1;
      fVar3 = (this_01->mTransformation).a2;
      fVar4 = (this_01->mTransformation).a3;
      fVar5 = (this_01->mTransformation).a4;
      fVar26 = fVar2 * 0.0;
      fVar31 = fVar5 * 0.0;
      fVar6 = (this_01->mTransformation).b1;
      fVar7 = (this_01->mTransformation).b2;
      fVar8 = (this_01->mTransformation).b3;
      fVar9 = (this_01->mTransformation).b4;
      fVar30 = fVar6 * 0.0;
      fVar32 = fVar9 * 0.0;
      fVar10 = (this_01->mTransformation).c1;
      fVar11 = (this_01->mTransformation).c2;
      fVar12 = (this_01->mTransformation).c3;
      fVar34 = fVar10 * 0.0;
      fVar13 = (this_01->mTransformation).c4;
      fVar35 = fVar13 * 0.0;
      fVar14 = (this_01->mTransformation).d2;
      fVar15 = (this_01->mTransformation).d1;
      fVar36 = fVar15 * 0.0;
      fVar16 = (this_01->mTransformation).d3;
      fVar17 = (this_01->mTransformation).d4;
      fVar29 = fVar17 * 0.0;
      (this_01->mTransformation).a1 = fVar2 + fVar3 * 0.0 + fVar4 * 0.0 + fVar31;
      (this_01->mTransformation).a2 = fVar28 * fVar4 + fVar27 * fVar3 + fVar26 + fVar31;
      (this_01->mTransformation).a3 = fVar4 * fVar27 + (fVar26 - fVar3 * fVar28) + fVar31;
      (this_01->mTransformation).a4 = fVar26 + fVar3 * 0.0 + fVar4 * 0.0 + fVar5;
      (this_01->mTransformation).b1 = fVar6 + fVar7 * 0.0 + fVar8 * 0.0 + fVar32;
      (this_01->mTransformation).b2 = fVar28 * fVar8 + fVar27 * fVar7 + fVar30 + fVar32;
      (this_01->mTransformation).b3 = fVar8 * fVar27 + (fVar30 - fVar7 * fVar28) + fVar32;
      (this_01->mTransformation).b4 = fVar30 + fVar7 * 0.0 + fVar8 * 0.0 + fVar9;
      (this_01->mTransformation).c1 = fVar10 + fVar11 * 0.0 + fVar12 * 0.0 + fVar35;
      (this_01->mTransformation).c2 = fVar28 * fVar12 + fVar27 * fVar11 + fVar34 + fVar35;
      (this_01->mTransformation).c3 = fVar12 * fVar27 + (fVar34 - fVar11 * fVar28) + fVar35;
      (this_01->mTransformation).c4 = fVar34 + fVar11 * 0.0 + fVar12 * 0.0 + fVar13;
      (this_01->mTransformation).d1 = fVar15 + fVar14 * 0.0 + fVar16 * 0.0 + fVar29;
      (this_01->mTransformation).d2 = fVar28 * fVar16 + fVar27 * fVar14 + fVar36 + fVar29;
      (this_01->mTransformation).d3 = fVar27 * fVar16 + (fVar36 - fVar14 * fVar28) + fVar29;
      (this_01->mTransformation).d4 = fVar36 + fVar14 * 0.0 + fVar16 * 0.0 + fVar17;
      fVar2 = *(float *)&p_Var21[8]._M_next;
      fVar27 = cosf(fVar2);
      fVar28 = sinf(fVar2);
      fVar2 = (this_01->mTransformation).a1;
      fVar3 = (this_01->mTransformation).a2;
      fVar35 = fVar3 * 0.0;
      fVar4 = (this_01->mTransformation).a3;
      fVar5 = (this_01->mTransformation).a4;
      fVar30 = fVar5 * 0.0;
      fVar6 = (this_01->mTransformation).b1;
      fVar7 = (this_01->mTransformation).b2;
      fVar36 = fVar7 * 0.0;
      fVar8 = (this_01->mTransformation).b3;
      fVar9 = (this_01->mTransformation).b4;
      fVar31 = fVar9 * 0.0;
      fVar10 = (this_01->mTransformation).c1;
      fVar11 = (this_01->mTransformation).c2;
      fVar29 = fVar11 * 0.0;
      fVar12 = (this_01->mTransformation).c3;
      fVar13 = (this_01->mTransformation).c4;
      fVar34 = fVar13 * 0.0;
      fVar14 = (this_01->mTransformation).d2;
      fVar32 = fVar14 * 0.0;
      fVar15 = (this_01->mTransformation).d1;
      fVar16 = (this_01->mTransformation).d3;
      fVar17 = (this_01->mTransformation).d4;
      fVar26 = fVar17 * 0.0;
      (this_01->mTransformation).a1 = ((fVar27 * fVar2 + fVar35) - fVar28 * fVar4) + fVar30;
      (this_01->mTransformation).a2 = fVar3 + fVar2 * 0.0 + fVar4 * 0.0 + fVar30;
      (this_01->mTransformation).a3 = fVar28 * fVar2 + fVar35 + fVar27 * fVar4 + fVar30;
      (this_01->mTransformation).a4 = fVar2 * 0.0 + fVar35 + fVar4 * 0.0 + fVar5;
      (this_01->mTransformation).b1 = ((fVar27 * fVar6 + fVar36) - fVar28 * fVar8) + fVar31;
      (this_01->mTransformation).b2 = fVar7 + fVar6 * 0.0 + fVar8 * 0.0 + fVar31;
      (this_01->mTransformation).b3 = fVar28 * fVar6 + fVar36 + fVar27 * fVar8 + fVar31;
      (this_01->mTransformation).b4 = fVar6 * 0.0 + fVar36 + fVar8 * 0.0 + fVar9;
      (this_01->mTransformation).c1 = ((fVar27 * fVar10 + fVar29) - fVar28 * fVar12) + fVar34;
      (this_01->mTransformation).c2 = fVar11 + fVar10 * 0.0 + fVar12 * 0.0 + fVar34;
      (this_01->mTransformation).c3 = fVar28 * fVar10 + fVar29 + fVar27 * fVar12 + fVar34;
      (this_01->mTransformation).c4 = fVar10 * 0.0 + fVar29 + fVar12 * 0.0 + fVar13;
      (this_01->mTransformation).d1 = ((fVar27 * fVar15 + fVar32) - fVar28 * fVar16) + fVar26;
      (this_01->mTransformation).d2 = fVar14 + fVar15 * 0.0 + fVar16 * 0.0 + fVar26;
      (this_01->mTransformation).d3 = fVar28 * fVar15 + fVar32 + fVar27 * fVar16 + fVar26;
      (this_01->mTransformation).d4 = fVar15 * 0.0 + fVar32 + fVar16 * 0.0 + fVar17;
      fVar2 = *(float *)((long)(p_Var21 + 8) + 4);
      fVar27 = cosf(fVar2);
      fVar28 = sinf(fVar2);
      fVar2 = (this_01->mTransformation).a1;
      fVar3 = (this_01->mTransformation).a2;
      fVar4 = (this_01->mTransformation).a3;
      fVar31 = fVar4 * 0.0;
      fVar5 = (this_01->mTransformation).a4;
      fVar30 = fVar2 * 0.0 + fVar3 * 0.0;
      fVar32 = fVar5 * 0.0;
      fVar6 = (this_01->mTransformation).b1;
      fVar7 = (this_01->mTransformation).b2;
      fVar8 = (this_01->mTransformation).b3;
      fVar35 = fVar8 * 0.0;
      fVar9 = (this_01->mTransformation).b4;
      fVar34 = fVar6 * 0.0 + fVar7 * 0.0;
      fVar33 = fVar9 * 0.0;
      fVar10 = (this_01->mTransformation).c1;
      fVar11 = (this_01->mTransformation).c2;
      fVar12 = (this_01->mTransformation).c3;
      fVar39 = fVar12 * 0.0;
      fVar36 = fVar10 * 0.0 + fVar11 * 0.0;
      fVar13 = (this_01->mTransformation).c4;
      fVar37 = fVar13 * 0.0;
      fVar14 = (this_01->mTransformation).d2;
      fVar15 = (this_01->mTransformation).d1;
      fVar38 = fVar15 * 0.0 + fVar14 * 0.0;
      fVar16 = (this_01->mTransformation).d3;
      fVar29 = fVar16 * 0.0;
      fVar17 = (this_01->mTransformation).d4;
      fVar26 = fVar17 * 0.0;
      (this_01->mTransformation).a1 = fVar27 * fVar2 + fVar28 * fVar3 + fVar31 + fVar32;
      (this_01->mTransformation).a2 = (fVar27 * fVar3 - fVar28 * fVar2) + fVar31 + fVar32;
      (this_01->mTransformation).a3 = fVar4 + fVar30 + fVar32;
      (this_01->mTransformation).a4 = fVar30 + fVar31 + fVar5;
      (this_01->mTransformation).b1 = fVar27 * fVar6 + fVar28 * fVar7 + fVar35 + fVar33;
      (this_01->mTransformation).b2 = (fVar27 * fVar7 - fVar28 * fVar6) + fVar35 + fVar33;
      (this_01->mTransformation).b3 = fVar8 + fVar34 + fVar33;
      (this_01->mTransformation).b4 = fVar34 + fVar35 + fVar9;
      (this_01->mTransformation).c1 = fVar27 * fVar10 + fVar28 * fVar11 + fVar39 + fVar37;
      (this_01->mTransformation).c2 = (fVar27 * fVar11 - fVar28 * fVar10) + fVar39 + fVar37;
      (this_01->mTransformation).c3 = fVar12 + fVar36 + fVar37;
      (this_01->mTransformation).c4 = fVar36 + fVar39 + fVar13;
      (this_01->mTransformation).d1 = fVar27 * fVar15 + fVar28 * fVar14 + fVar29 + fVar26;
      (this_01->mTransformation).d2 = (fVar27 * fVar14 - fVar28 * fVar15) + fVar29 + fVar26;
      (this_01->mTransformation).d3 = fVar16 + fVar38 + fVar26;
      (this_01->mTransformation).d4 = fVar38 + fVar29 + fVar17;
      this_01->mNumChildren = 1;
      ppaVar20 = (aiNode **)operator_new__(8);
      this_01->mChildren = ppaVar20;
      SceneCombiner::Copy(ppaVar20,local_38);
      (*this_01->mChildren)->mParent = this_01;
      p_Var21 = (_List_node_base *)operator_new(0x18);
      p_Var21[1]._M_next = (_List_node_base *)this_01;
      std::__detail::_List_node_base::_M_hook(p_Var21);
      local_40 = local_40 + 1;
    }
    else if (*(int *)&p_Var21->_M_prev != 6) {
      prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Only <instance> nodes can be in <constellation>.","");
      std::runtime_error::runtime_error(prVar24,(string *)local_70);
      *(undefined ***)prVar24 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var23 = p_Var23->_M_next;
  } while( true );
}

Assistant:

void AMFImporter::Postprocess_BuildConstellation(CAMFImporter_NodeElement_Constellation& pConstellation, std::list<aiNode*>& pNodeList) const
{
aiNode* con_node;
std::list<aiNode*> ch_node;

	// We will build next hierarchy:
	// aiNode as parent (<constellation>) for set of nodes as a children
	//  |- aiNode for transformation (<instance> -> <delta...>, <r...>) - aiNode for pointing to object ("objectid")
	//  ...
	//  \_ aiNode for transformation (<instance> -> <delta...>, <r...>) - aiNode for pointing to object ("objectid")
	con_node = new aiNode;
	con_node->mName = pConstellation.ID;
	// Walk through children and search for instances of another objects, constellations.
	for(const CAMFImporter_NodeElement* ne: pConstellation.Child)
	{
		aiMatrix4x4 tmat;
		aiNode* t_node;
		aiNode* found_node;

		if(ne->Type == CAMFImporter_NodeElement::ENET_Metadata) continue;
		if(ne->Type != CAMFImporter_NodeElement::ENET_Instance) throw DeadlyImportError("Only <instance> nodes can be in <constellation>.");

		// create alias for conveniance
		CAMFImporter_NodeElement_Instance& als = *((CAMFImporter_NodeElement_Instance*)ne);
		// find referenced object
		if(!Find_ConvertedNode(als.ObjectID, pNodeList, &found_node)) Throw_ID_NotFound(als.ObjectID);

		// create node for applying transformation
		t_node = new aiNode;
		t_node->mParent = con_node;
		// apply transformation
		aiMatrix4x4::Translation(als.Delta, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationX(als.Rotation.x, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationY(als.Rotation.y, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationZ(als.Rotation.z, tmat), t_node->mTransformation *= tmat;
		// create array for one child node
		t_node->mNumChildren = 1;
		t_node->mChildren = new aiNode*[t_node->mNumChildren];
		SceneCombiner::Copy(&t_node->mChildren[0], found_node);
		t_node->mChildren[0]->mParent = t_node;
		ch_node.push_back(t_node);
	}// for(const CAMFImporter_NodeElement* ne: pConstellation.Child)

	// copy found aiNode's as children
	if(ch_node.empty()) throw DeadlyImportError("<constellation> must have at least one <instance>.");

	size_t ch_idx = 0;

	con_node->mNumChildren = static_cast<unsigned int>(ch_node.size());
	con_node->mChildren = new aiNode*[con_node->mNumChildren];
	for(aiNode* node: ch_node) con_node->mChildren[ch_idx++] = node;

	// and place "root" of <constellation> node to node list
	pNodeList.push_back(con_node);
}